

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O1

bool __thiscall
ON_CurveProxy::Split(ON_CurveProxy *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  ON_Curve *real_curve;
  bool bVar1;
  bool bVar2;
  ON_CurveProxy *pOVar3;
  ON_CurveProxy *pOVar4;
  double *pdVar5;
  byte bVar6;
  byte bVar7;
  double dVar8;
  double dVar9;
  double t1;
  ON_Interval right_real_dom;
  ON_Interval left_real_dom;
  ON_Interval right_this_dom;
  ON_Interval left_this_dom;
  ON_Interval d;
  ON_Interval local_90;
  ON_Interval local_80;
  ON_CurveProxy *local_70;
  ON_CurveProxy *local_68;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  this_00 = &this->m_this_domain;
  bVar1 = ON_Interval::IsIncreasing(this_00);
  if (!bVar1) {
    return false;
  }
  this_01 = &this->m_real_curve_domain;
  bVar1 = ON_Interval::IsIncreasing(this_01);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_Interval::Includes(this_00,t,true);
  if (!bVar1) {
    return false;
  }
  dVar8 = RealCurveParameter(this,t);
  bVar1 = ON_Interval::Includes(this_01,dVar8,true);
  if (bVar1) {
    pOVar4 = (ON_CurveProxy *)*left_side;
    if (pOVar4 == (ON_CurveProxy *)0x0) {
      local_70 = (ON_CurveProxy *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar4,&m_ON_CurveProxy_class_rtti);
      pOVar3 = (ON_CurveProxy *)0x0;
      local_70 = pOVar4;
      if (!bVar1) {
        local_70 = pOVar3;
      }
      if (local_70 == (ON_CurveProxy *)0x0) goto LAB_00435ce4;
    }
    pOVar4 = (ON_CurveProxy *)*right_side;
    if (pOVar4 == (ON_CurveProxy *)0x0) {
      local_68 = (ON_CurveProxy *)0x0;
LAB_00435d2c:
      bVar1 = this->m_bReversed;
      ON_Interval::ON_Interval(&local_80);
      ON_Interval::ON_Interval(&local_90);
      if (bVar1 == true) {
        dVar9 = ON_Interval::operator[](this_01,1);
        ON_Interval::Set(&local_80,dVar8,dVar9);
        dVar9 = ON_Interval::operator[](this_01,0);
        t1 = dVar8;
      }
      else {
        dVar9 = ON_Interval::operator[](this_01,0);
        ON_Interval::Set(&local_80,dVar9,dVar8);
        t1 = ON_Interval::operator[](this_01,1);
        dVar9 = dVar8;
      }
      ON_Interval::Set(&local_90,dVar9,t1);
      bVar7 = 0;
      dVar8 = ON_Interval::operator[](this_00,0);
      ON_Interval::ON_Interval(&local_50,dVar8,t);
      dVar8 = ON_Interval::operator[](this_00,1);
      ON_Interval::ON_Interval(&local_60,t,dVar8);
      bVar2 = ON_Interval::IsIncreasing(&local_80);
      pOVar3 = (ON_CurveProxy *)0x1;
      bVar6 = 1;
      if (!bVar2) goto LAB_00435ce7;
      bVar2 = ON_Interval::IsIncreasing(&local_90);
      if (((bVar2) && (bVar2 = ON_Interval::IsIncreasing(&local_50), bVar2)) &&
         (bVar2 = ON_Interval::IsIncreasing(&local_60), bVar2)) {
        real_curve = this->m_real_curve;
        if (real_curve != (ON_Curve *)0x0) {
          (*(real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(real_curve);
          local_40.m_t[1] = dVar8;
          bVar2 = ON_Interval::Includes(&local_40,&local_80,false);
          if (!bVar2) goto LAB_00435d25;
          bVar6 = 0;
          bVar2 = ON_Interval::Includes(&local_40,&local_90,false);
          bVar7 = 0;
          if (!bVar2) goto LAB_00435ce7;
        }
        pOVar3 = local_70;
        if (local_70 == (ON_CurveProxy *)0x0) {
          pOVar3 = (ON_CurveProxy *)operator_new(0x40);
          ON_CurveProxy(pOVar3);
        }
        pOVar4 = local_68;
        if (local_68 == (ON_CurveProxy *)0x0) {
          pOVar4 = (ON_CurveProxy *)operator_new(0x40);
          ON_CurveProxy(pOVar4);
        }
        SetProxyCurve(pOVar3,real_curve,local_80);
        SetProxyCurve(pOVar4,real_curve,local_90);
        if (bVar1 != false) {
          (*(pOVar3->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                    (pOVar3);
          (*(pOVar4->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                    (pOVar4);
        }
        pdVar5 = ON_Interval::operator[](&local_50,0);
        dVar8 = *pdVar5;
        pdVar5 = ON_Interval::operator[](&local_50,1);
        (*(pOVar3->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (dVar8,*pdVar5,pOVar3);
        pdVar5 = ON_Interval::operator[](&local_60,0);
        dVar8 = *pdVar5;
        pdVar5 = ON_Interval::operator[](&local_60,1);
        (*(pOVar4->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (dVar8,*pdVar5,pOVar4);
        if (*left_side == (ON_Curve *)0x0) {
          *left_side = &pOVar3->super_ON_Curve;
        }
        bVar6 = 1;
        if (*right_side == (ON_Curve *)0x0) {
          *right_side = &pOVar4->super_ON_Curve;
        }
        bVar7 = 1;
        goto LAB_00435ce7;
      }
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar4,&m_ON_CurveProxy_class_rtti);
      pOVar3 = (ON_CurveProxy *)0x0;
      local_68 = pOVar4;
      if (!bVar1) {
        local_68 = pOVar3;
      }
      if (local_68 != (ON_CurveProxy *)0x0) {
        if (*right_side != *left_side) goto LAB_00435d2c;
LAB_00435d25:
        pOVar3 = (ON_CurveProxy *)0x0;
      }
    }
  }
  else {
    pOVar3 = (ON_CurveProxy *)0x1;
  }
LAB_00435ce4:
  bVar6 = (byte)pOVar3;
  bVar7 = 0;
LAB_00435ce7:
  return (bool)(bVar6 & bVar7);
}

Assistant:

bool ON_CurveProxy::Split(
    double t,
    ON_Curve*& left_side,
    ON_Curve*& right_side
  ) const
{
  bool rc = false;
  if ( m_this_domain.IsIncreasing() && m_real_curve_domain.IsIncreasing() && m_this_domain.Includes(t,true) )
  {
    double crv_t = RealCurveParameter(t);
    if ( m_real_curve_domain.Includes(crv_t,true) )
    {
      ON_CurveProxy* left_proxy = 0;
      ON_CurveProxy* right_proxy = 0;
      if ( left_side )
      {
        left_proxy = ON_CurveProxy::Cast(left_side);
        if ( !left_proxy )
          return false;
      }
      if ( right_side )
      {
        right_proxy = ON_CurveProxy::Cast(right_side);
        if ( !right_proxy )
          return false;
        if ( right_side == left_side )
          return false;
      }

      bool bRev = m_bReversed;

      ON_Interval left_real_dom, right_real_dom;
      if ( bRev )
      {
        left_real_dom.Set(crv_t,m_real_curve_domain[1]);
        right_real_dom.Set(m_real_curve_domain[0],crv_t);
      }
      else
      {
        left_real_dom.Set(m_real_curve_domain[0],crv_t);
        right_real_dom.Set(crv_t,m_real_curve_domain[1]);
      }

      ON_Interval left_this_dom(m_this_domain[0],t);
      ON_Interval right_this_dom(t,m_this_domain[1]);

      if (    left_real_dom.IsIncreasing() 
           && right_real_dom.IsIncreasing()
           && left_this_dom.IsIncreasing()
           && right_this_dom.IsIncreasing()
           )
      {
        // note well that left_proxy or right_proxy might also be this
        const ON_Curve* real_crv = m_real_curve;
        if ( real_crv )
        {
          ON_Interval d = real_crv->Domain();
          if ( !d.Includes(left_real_dom) )
            return false;
          if ( !d.Includes(right_real_dom) )
            return false;
        }

        if ( !left_proxy )
          left_proxy = new ON_CurveProxy();
        if ( !right_proxy )
          right_proxy = new ON_CurveProxy();

        left_proxy->SetProxyCurve( real_crv, left_real_dom );
        right_proxy->SetProxyCurve( real_crv, right_real_dom );

        if ( bRev )
        {
          left_proxy->Reverse();
          right_proxy->Reverse();
        }

        left_proxy->SetDomain(left_this_dom[0],left_this_dom[1]);
        right_proxy->SetDomain(right_this_dom[0],right_this_dom[1]);

        if (!left_side) left_side = left_proxy;
        if (!right_side) right_side = right_proxy;

        rc = true;
      }
    }
  }
  return rc;
}